

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinRoberts_fp.c
# Opt level: O0

int main(void)

{
  undefined4 uVar1;
  int iVar2;
  long *atol;
  N_Vector y_00;
  void *kmem;
  int retval;
  N_Vector scale;
  N_Vector y;
  sunrealtype fnorm;
  sunrealtype fnormtol;
  SUNContext sunctx;
  int in_stack_ffffffffffffffbc;
  char *pcVar3;
  undefined4 in_stack_ffffffffffffffc8;
  sunrealtype rtol;
  N_Vector u;
  undefined8 local_10;
  int local_4;
  
  local_4 = 0;
  rtol = 0.0;
  pcVar3 = (char *)0x0;
  printf("Example problem from chemical kinetics solving\n");
  printf("the first time step in a Backward Euler solution for the\n");
  printf("following three rate equations:\n");
  printf("    dy1/dt = -.04*y1 + 1.e4*y2*y3\n");
  printf("    dy2/dt = .04*y1 - 1.e4*y2*y3 - 3.e2*(y2)^2\n");
  printf("    dy3/dt = 3.e2*(y2)^2\n");
  printf("on the interval from t = 0.0 to t = 0.1, with initial\n");
  printf("conditions: y1 = 1.0, y2 = y3 = 0.\n");
  printf("Solution method: Anderson accelerated fixed point iteration.\n");
  uVar1 = SUNContext_Create(0,&local_10);
  iVar2 = check_retval((void *)CONCAT44(uVar1,in_stack_ffffffffffffffc8),pcVar3,
                       in_stack_ffffffffffffffbc);
  if (iVar2 == 0) {
    atol = (long *)N_VNew_Serial(3,local_10);
    iVar2 = check_retval((void *)CONCAT44(uVar1,in_stack_ffffffffffffffc8),pcVar3,
                         in_stack_ffffffffffffffbc);
    if (iVar2 == 0) {
      y_00 = (N_Vector)N_VNew_Serial(3,local_10);
      iVar2 = check_retval((void *)CONCAT44(uVar1,in_stack_ffffffffffffffc8),pcVar3,
                           in_stack_ffffffffffffffbc);
      if (iVar2 == 0) {
        pcVar3 = (char *)KINCreate(local_10);
        iVar2 = check_retval((void *)CONCAT44(uVar1,in_stack_ffffffffffffffc8),pcVar3,
                             in_stack_ffffffffffffffbc);
        if (iVar2 == 0) {
          KINSetMAA(pcVar3,2);
          uVar1 = KINInit(pcVar3,funcRoberts,atol);
          iVar2 = check_retval((void *)CONCAT44(uVar1,in_stack_ffffffffffffffc8),pcVar3,
                               in_stack_ffffffffffffffbc);
          if (iVar2 == 0) {
            u = (N_Vector)&DAT_3ddb7cdfd9d7bdbb;
            uVar1 = KINSetFuncNormTol(&DAT_3ddb7cdfd9d7bdbb,pcVar3);
            iVar2 = check_retval((void *)CONCAT44(uVar1,in_stack_ffffffffffffffc8),pcVar3,
                                 in_stack_ffffffffffffffbc);
            if (iVar2 == 0) {
              N_VConst(0,atol);
              **(undefined8 **)(*atol + 0x10) = 0x3ff0000000000000;
              N_VConst(0x3ff0000000000000,y_00);
              uVar1 = KINSol(pcVar3,atol,3,y_00,y_00);
              iVar2 = check_retval((void *)CONCAT44(uVar1,in_stack_ffffffffffffffc8),pcVar3,
                                   in_stack_ffffffffffffffbc);
              if (iVar2 == 0) {
                uVar1 = KINGetFuncNorm(pcVar3,&stack0xffffffffffffffe0);
                iVar2 = check_retval((void *)CONCAT44(uVar1,in_stack_ffffffffffffffc8),pcVar3,
                                     in_stack_ffffffffffffffbc);
                if (iVar2 == 0) {
                  printf("\nComputed solution (||F|| = %g):\n\n",rtol);
                  PrintOutput(y_00);
                  PrintFinalStats(y_00);
                  iVar2 = check_ans(u,rtol,(sunrealtype)atol);
                  N_VDestroy(atol);
                  N_VDestroy(y_00);
                  KINFree(&stack0xffffffffffffffc0);
                  SUNContext_Free(&local_10);
                  local_4 = iVar2;
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  sunrealtype fnormtol, fnorm;
  N_Vector y, scale;
  int retval;
  void* kmem;

  fnorm = 0.0;
  y = scale = NULL;
  kmem      = NULL;

  /* -------------------------
   * Print problem description
   * ------------------------- */

  printf("Example problem from chemical kinetics solving\n");
  printf("the first time step in a Backward Euler solution for the\n");
  printf("following three rate equations:\n");
  printf("    dy1/dt = -.04*y1 + 1.e4*y2*y3\n");
  printf("    dy2/dt = .04*y1 - 1.e4*y2*y3 - 3.e2*(y2)^2\n");
  printf("    dy3/dt = 3.e2*(y2)^2\n");
  printf("on the interval from t = 0.0 to t = 0.1, with initial\n");
  printf("conditions: y1 = 1.0, y2 = y3 = 0.\n");
  printf("Solution method: Anderson accelerated fixed point iteration.\n");

  /* Create the SUNDIALS context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* --------------------------------------
   * Create vectors for solution and scales
   * -------------------------------------- */

  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  scale = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)scale, "N_VNew_Serial", 0)) { return (1); }

  /* -----------------------------------------
   * Initialize and allocate memory for KINSOL
   * ----------------------------------------- */

  kmem = KINCreate(sunctx);
  if (check_retval((void*)kmem, "KINCreate", 0)) { return (1); }

  /* y is used as a template */

  /* Set number of prior residuals used in Anderson acceleration */
  retval = KINSetMAA(kmem, PRIORS);

  retval = KINInit(kmem, funcRoberts, y);
  if (check_retval(&retval, "KINInit", 1)) { return (1); }

  /* -------------------
   * Set optional inputs
   * ------------------- */

  /* Specify stopping tolerance based on residual */

  fnormtol = TOL;
  retval   = KINSetFuncNormTol(kmem, fnormtol);
  if (check_retval(&retval, "KINSetFuncNormTol", 1)) { return (1); }

  /* -------------
   * Initial guess
   * ------------- */

  N_VConst(ZERO, y);
  Ith(y, 1) = ONE;

  /* ----------------------------
   * Call KINSol to solve problem
   * ---------------------------- */

  /* No scaling used */
  N_VConst(ONE, scale);

  /* Call main solver */
  retval = KINSol(kmem,   /* KINSol memory block */
                  y,      /* initial guess on input; solution vector */
                  KIN_FP, /* global strategy choice */
                  scale,  /* scaling vector, for the variable cc */
                  scale); /* scaling vector for function values fval */
  if (check_retval(&retval, "KINSol", 1)) { return (1); }

  /* ------------------------------------
   * Print solution and solver statistics
   * ------------------------------------ */

  /* Get scaled norm of the system function */

  retval = KINGetFuncNorm(kmem, &fnorm);
  if (check_retval(&retval, "KINGetfuncNorm", 1)) { return (1); }

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("\nComputed solution (||F|| = %Lg):\n\n", fnorm);
#else
  printf("\nComputed solution (||F|| = %g):\n\n", fnorm);
#endif
  PrintOutput(y);

  PrintFinalStats(kmem);

  /* check the solution error */
  retval = check_ans(y, SUN_RCONST(1e-4), SUN_RCONST(1e-6));

  /* -----------
   * Free memory
   * ----------- */

  N_VDestroy(y);
  N_VDestroy(scale);
  KINFree(&kmem);
  SUNContext_Free(&sunctx);

  return (retval);
}